

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalExpressionSyntax,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ConditionalPredicateSyntax *args,Token *args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,ExpressionSyntax *args_3,
          Token *args_4,ExpressionSyntax *args_5)

{
  Token question;
  Token colon;
  ConditionalExpressionSyntax *this_00;
  
  this_00 = (ConditionalExpressionSyntax *)allocate(this,0x88,8);
  question.kind = args_1->kind;
  question._2_1_ = args_1->field_0x2;
  question.numFlags.raw = (args_1->numFlags).raw;
  question.rawLen = args_1->rawLen;
  question.info = args_1->info;
  colon.kind = args_4->kind;
  colon._2_1_ = args_4->field_0x2;
  colon.numFlags.raw = (args_4->numFlags).raw;
  colon.rawLen = args_4->rawLen;
  colon.info = args_4->info;
  slang::syntax::ConditionalExpressionSyntax::ConditionalExpressionSyntax
            (this_00,args,question,args_2,args_3,colon,args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }